

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMeshEffect.cpp
# Opt level: O3

void __thiscall dgMeshEffect::EndPolygon(dgMeshEffect *this,HaF64 tol)

{
  dgBigVector *pdVar1;
  double dVar2;
  double dVar3;
  uint vertexCount;
  int iVar4;
  dgBigVector *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  HaI32 HVar9;
  HaI32 *indexListOut;
  HaI32 *indexListOut_00;
  int *piVar10;
  dgEdge *pdVar11;
  long lVar12;
  int iVar13;
  int entry;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  dgStack<int> attrIndexMap;
  dgStack<int> indexMap;
  HaI64 userdata [3];
  int local_7c;
  undefined8 local_78;
  HaF64 local_70;
  dgStack<int> local_68;
  dgStack<int> local_58;
  long local_48;
  long local_40;
  long local_38;
  
  vertexCount = *(uint *)&(this->super_dgRefCounter).field_0xc;
  local_70 = tol;
  indexListOut = (HaI32 *)malloc((long)(int)(vertexCount * 4));
  iVar13 = this->m_atribCount;
  local_58.super_dgStackBase.m_ptr = indexListOut;
  local_58.m_size = vertexCount;
  indexListOut_00 = (HaI32 *)malloc((long)(iVar13 * 4));
  local_68.super_dgStackBase.m_ptr = indexListOut_00;
  local_68.m_size = iVar13;
  if (-1 < (int)vertexCount) {
    HVar9 = dgVertexListToIndexList
                      ((HaF64 *)this->m_points,0x20,4,vertexCount,indexListOut,local_70);
    *(HaI32 *)&(this->super_dgRefCounter).field_0xc = HVar9;
    if (-1 < iVar13) {
      HVar9 = dgVertexListToIndexList
                        ((HaF64 *)this->m_attib,0x60,0xc,this->m_atribCount,indexListOut_00,local_70
                        );
      this->m_atribCount = HVar9;
      if (2 < vertexCount) {
        entry = 0;
        iVar13 = (int)vertexCount / 3;
        do {
          piVar10 = dgStack<int>::operator[](&local_58,entry);
          local_7c = *piVar10;
          piVar10 = dgStack<int>::operator[](&local_58,entry + 1);
          local_78 = CONCAT44(local_78._4_4_,*piVar10);
          piVar10 = dgStack<int>::operator[](&local_58,entry + 2);
          iVar4 = *piVar10;
          auVar26._8_8_ = 0x7fffffffffffffff;
          auVar26._0_8_ = 0x7fffffffffffffff;
          auVar26._16_8_ = 0x7fffffffffffffff;
          auVar26._24_8_ = 0x7fffffffffffffff;
          auVar27._8_8_ = 0x7fefffffffffffff;
          auVar27._0_8_ = 0x7fefffffffffffff;
          auVar27._16_8_ = 0x7fefffffffffffff;
          auVar27._24_8_ = 0x7fefffffffffffff;
          local_78 = CONCAT44(iVar4,(int)local_78);
          lVar12 = (long)(int)local_78;
          pdVar5 = this->m_points;
          dVar20 = pdVar5[local_7c].super_dgTemplateVector<double>.m_z;
          auVar14._0_8_ = pdVar5[local_7c].super_dgTemplateVector<double>.m_x;
          auVar14._8_8_ = pdVar5[local_7c].super_dgTemplateVector<double>.m_y;
          auVar7._0_8_ = pdVar5[lVar12].super_dgTemplateVector<double>.m_x;
          auVar7._8_8_ = pdVar5[lVar12].super_dgTemplateVector<double>.m_y;
          dVar2 = pdVar5[lVar12].super_dgTemplateVector<double>.m_w;
          auVar23._8_8_ = dVar2;
          auVar23._0_8_ = dVar2;
          auVar23._16_8_ = dVar2;
          auVar23._24_8_ = dVar2;
          dVar2 = pdVar5[lVar12].super_dgTemplateVector<double>.m_z - dVar20;
          auVar7 = vsubpd_avx(auVar7,auVar14);
          auVar24._8_8_ = dVar2;
          auVar24._0_8_ = dVar2;
          auVar24._16_8_ = dVar2;
          auVar24._24_8_ = dVar2;
          auVar24 = vblendpd_avx(ZEXT1632(auVar7),auVar24,4);
          auVar24 = vblendpd_avx(auVar24,auVar23,8);
          auVar24 = vandpd_avx(auVar24,auVar26);
          uVar8 = vpcmpgtq_avx512vl(auVar24,auVar27);
          if ((uVar8 & 0xf) != 0) {
LAB_00867301:
            __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                          ,0x145,"dgBigVector::dgBigVector(const dgTemplateVector<hacd::HaF64> &)");
          }
          auVar6._0_8_ = pdVar5[iVar4].super_dgTemplateVector<double>.m_x;
          auVar6._8_8_ = pdVar5[iVar4].super_dgTemplateVector<double>.m_y;
          auVar14 = vsubpd_avx(auVar6,auVar14);
          dVar20 = pdVar5[iVar4].super_dgTemplateVector<double>.m_z - dVar20;
          dVar3 = pdVar5[iVar4].super_dgTemplateVector<double>.m_w;
          auVar19._8_8_ = dVar3;
          auVar19._0_8_ = dVar3;
          auVar19._16_8_ = dVar3;
          auVar19._24_8_ = dVar3;
          auVar25._8_8_ = dVar20;
          auVar25._0_8_ = dVar20;
          auVar25._16_8_ = dVar20;
          auVar25._24_8_ = dVar20;
          auVar24 = vblendpd_avx(ZEXT1632(auVar14),auVar25,4);
          auVar24 = vblendpd_avx(auVar24,auVar19,8);
          auVar24 = vandpd_avx(auVar24,auVar26);
          uVar8 = vpcmpgtq_avx512vl(auVar24,auVar27);
          if ((uVar8 & 0xf) != 0) goto LAB_00867301;
          auVar6 = vshufpd_avx(auVar14,auVar14,1);
          auVar15 = vshufpd_avx(auVar7,auVar7,1);
          auVar18._8_8_ = 0;
          auVar18._0_8_ = auVar6._0_8_ * dVar2;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar20;
          auVar18 = vfmsub231sd_fma(auVar18,auVar15,auVar21);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = dVar2;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = dVar20 * auVar7._0_8_;
          auVar16 = vfmsub231sd_fma(auVar22,auVar14,auVar16);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = auVar14._0_8_ * auVar15._0_8_;
          auVar14 = vfmsub231sd_fma(auVar17,auVar7,auVar6);
          dVar20 = auVar16._0_8_;
          if (((0x7fefffffffffffff < (auVar18._0_8_ & 0x7fffffffffffffff)) ||
              (0x7fefffffffffffff < (ulong)ABS(dVar20))) ||
             (0x7fefffffffffffff < (auVar14._0_8_ & 0x7fffffffffffffff))) goto LAB_00867301;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = dVar20 * dVar20;
          auVar7 = vfmadd213sd_fma(auVar18,auVar18,auVar15);
          auVar14 = vfmadd213sd_fma(auVar14,auVar14,auVar7);
          if (9.999999960041972e-13 < auVar14._0_8_) {
            piVar10 = dgStack<int>::operator[](&local_68,entry);
            local_48 = (long)*piVar10;
            piVar10 = dgStack<int>::operator[](&local_68,entry + 1);
            local_40 = (long)*piVar10;
            piVar10 = dgStack<int>::operator[](&local_68,entry + 2);
            local_38 = (long)*piVar10;
            pdVar11 = dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_7c,&local_48);
            if (pdVar11 == (dgEdge *)0x0) {
              iVar4 = *(int *)&(this->super_dgRefCounter).field_0xc;
              if (this->m_maxPointCount < iVar4 + 3) {
                __assert_fail("(m_pointCount + 3) <= m_maxPointCount",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgMeshEffect.cpp"
                              ,0x471,"void dgMeshEffect::EndPolygon(hacd::HaF64)");
              }
              pdVar5 = this->m_points + local_7c;
              dVar20 = (pdVar5->super_dgTemplateVector<double>).m_y;
              dVar2 = (pdVar5->super_dgTemplateVector<double>).m_z;
              dVar3 = (pdVar5->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + iVar4;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar5->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar20;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar3;
              pdVar5 = this->m_points + (int)local_78;
              dVar20 = (pdVar5->super_dgTemplateVector<double>).m_y;
              dVar2 = (pdVar5->super_dgTemplateVector<double>).m_z;
              dVar3 = (pdVar5->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 1;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar5->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar20;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar3;
              pdVar5 = this->m_points + local_78._4_4_;
              dVar20 = (pdVar5->super_dgTemplateVector<double>).m_y;
              dVar2 = (pdVar5->super_dgTemplateVector<double>).m_z;
              dVar3 = (pdVar5->super_dgTemplateVector<double>).m_w;
              pdVar1 = this->m_points + (long)*(int *)&(this->super_dgRefCounter).field_0xc + 2;
              (pdVar1->super_dgTemplateVector<double>).m_x =
                   (pdVar5->super_dgTemplateVector<double>).m_x;
              (pdVar1->super_dgTemplateVector<double>).m_y = dVar20;
              (pdVar1->super_dgTemplateVector<double>).m_z = dVar2;
              (pdVar1->super_dgTemplateVector<double>).m_w = dVar3;
              local_7c = *(int *)&(this->super_dgRefCounter).field_0xc;
              auVar14 = vpbroadcastd_avx512vl();
              auVar14 = vpaddd_avx(auVar14,_DAT_009dd960);
              local_78 = auVar14._0_8_;
              *(int *)&(this->super_dgRefCounter).field_0xc = local_7c + 3;
              dgPolyhedra::AddFace(&this->super_dgPolyhedra,3,&local_7c,&local_48);
            }
          }
          entry = entry + 3;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      dgPolyhedra::EndFace(&this->super_dgPolyhedra);
      RepairTJoints(this,true);
      free(local_68.super_dgStackBase.m_ptr);
      free(local_58.super_dgStackBase.m_ptr);
      return;
    }
  }
  __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                ,0x60,"T &dgStack<int>::operator[](hacd::HaI32) [T = int]");
}

Assistant:

void dgMeshEffect::EndPolygon (hacd::HaF64 tol)
{
	dgStack<hacd::HaI32>indexMap(m_pointCount);
	dgStack<hacd::HaI32>attrIndexMap(m_atribCount);

#ifdef _DEBUG
	for (hacd::HaI32 i = 0; i < m_pointCount; i += 3) {
		dgBigVector p0 (m_points[i + 0]);
		dgBigVector p1 (m_points[i + 1]);
		dgBigVector p2 (m_points[i + 2]);
		dgBigVector e1 (p1 - p0);
		dgBigVector e2 (p2 - p0);
		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
//		HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
		HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
	}
#endif

	hacd::HaI32 triangCount = m_pointCount / 3;
	m_pointCount = dgVertexListToIndexList (&m_points[0].m_x, sizeof (dgBigVector), sizeof (dgBigVector)/sizeof (hacd::HaF64), m_pointCount, &indexMap[0], tol);
	m_atribCount = dgVertexListToIndexList (&m_attib[0].m_vertex.m_x, sizeof (dgVertexAtribute), sizeof (dgVertexAtribute)/sizeof (hacd::HaF64), m_atribCount, &attrIndexMap[0], tol);

	for (hacd::HaI32 i = 0; i < triangCount; i ++) {
		hacd::HaI32 index[3];
		hacd::HaI64 userdata[3];

		index[0] = indexMap[i * 3 + 0];
		index[1] = indexMap[i * 3 + 1];
		index[2] = indexMap[i * 3 + 2];


		dgBigVector e1 (m_points[index[1]] - m_points[index[0]]);
		dgBigVector e2 (m_points[index[2]] - m_points[index[0]]);

		dgBigVector n (e1 * e2);
		hacd::HaF64 mag2 = n % n;
		if (mag2 > hacd::HaF64 (1.0e-12f)) {
			userdata[0] = attrIndexMap[i * 3 + 0];
			userdata[1] = attrIndexMap[i * 3 + 1];
			userdata[2] = attrIndexMap[i * 3 + 2];
			dgEdge* const edge = AddFace (3, index, userdata);
			if (!edge) {
				HACD_ASSERT ((m_pointCount + 3) <= m_maxPointCount);

				m_points[m_pointCount + 0] = m_points[index[0]];
				m_points[m_pointCount + 1] = m_points[index[1]];
				m_points[m_pointCount + 2] = m_points[index[2]];

				index[0] = m_pointCount + 0;
				index[1] = m_pointCount + 1;
				index[2] = m_pointCount + 2;

				m_pointCount += 3;

				#ifdef _DEBUG
					dgEdge* test = AddFace (3, index, userdata);
					HACD_ASSERT (test);
				#else 
					AddFace (3, index, userdata);
				#endif
			}
		}
	}
	EndFace();

	RepairTJoints (true);


#ifdef _DEBUG
	dgPolyhedra::Iterator iter (*this);	
	for (iter.Begin(); iter; iter ++){
		dgEdge* const face = &(*iter);
		if (face->m_incidentFace > 0) {
			dgBigVector p0 (m_points[face->m_incidentVertex]);
			dgBigVector p1 (m_points[face->m_next->m_incidentVertex]);
			dgBigVector p2 (m_points[face->m_next->m_next->m_incidentVertex]);
			dgBigVector e1 (p1 - p0);
			dgBigVector e2 (p2 - p0);
			dgBigVector n (e1 * e2);
//			HACD_ASSERT (mag2 > DG_MESH_EFFECT_TRIANGLE_MIN_AREA);
			hacd::HaF64 mag2 = n % n;
			HACD_ASSERT (mag2 > hacd::HaF32 (0.0f));
		}
	}
#endif
}